

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O1

void funnelsort<8u,buffer_layout_bfs>(uchar **strings,size_t n,uchar **tmp)

{
  byte *pbVar1;
  byte *pbVar2;
  uchar *puVar3;
  char *__s;
  unsigned_long uVar4;
  size_t n0;
  int iVar5;
  ostream *poVar6;
  uchar **ppuVar7;
  size_t sVar8;
  uchar **ppuVar9;
  byte bVar10;
  byte bVar11;
  long lVar12;
  long lVar13;
  uchar *__s2;
  DI __d;
  array<unsigned_long,_8UL> buffer_count;
  array<Stream,_8UL> streams;
  array<unsigned_char_*,_108UL> buffers;
  fill<8U,_2U,_buffer_layout_bfs> local_471;
  DI local_470;
  array<unsigned_long,_8UL> local_468;
  long lStack_428;
  uchar **local_420;
  size_t local_418;
  array<Stream,_8UL> local_410;
  uchar *local_390 [8];
  undefined8 local_350 [8];
  undefined1 auStack_310 [736];
  
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"funnelsort",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(), n=",6);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  if (n < 0x20) {
    ppuVar7 = strings;
    if (1 < (long)n) {
      do {
        iVar5 = (int)n;
        n = (size_t)(iVar5 - 1);
        pbVar1 = ppuVar7[1];
        for (ppuVar9 = ppuVar7 + 1; strings < ppuVar9; ppuVar9 = ppuVar9 + -1) {
          pbVar2 = ppuVar9[-1];
          bVar10 = *pbVar2;
          bVar11 = *pbVar1;
          if (bVar10 != 0 && bVar10 == bVar11) {
            lVar12 = 1;
            do {
              bVar10 = pbVar2[lVar12];
              bVar11 = pbVar1[lVar12];
              if (bVar10 == 0) break;
              lVar12 = lVar12 + 1;
            } while (bVar10 == bVar11);
          }
          if (bVar10 <= bVar11) break;
          *ppuVar9 = pbVar2;
        }
        *ppuVar9 = pbVar1;
        ppuVar7 = ppuVar7 + 1;
      } while (2 < iVar5);
    }
  }
  else {
    local_410._M_elems[0].n = n >> 3;
    local_410._M_elems[0].stream = strings;
    lVar12 = 0x18;
    do {
      *(size_t *)((long)local_410._M_elems + lVar12 + -8) =
           *(long *)((long)&lStack_428 + lVar12) + local_410._M_elems[0].n * 8;
      *(size_t *)((long)&local_410._M_elems[0].stream + lVar12) = local_410._M_elems[0].n;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x78);
    local_410._M_elems[7].stream = local_410._M_elems[6].stream + local_410._M_elems[0].n;
    local_410._M_elems[7].n = local_410._M_elems[0].n * -7 + n;
    lVar12 = 8;
    local_418 = n;
    do {
      mergesort_4way(*(uchar ***)((long)local_410._M_elems + lVar12 + -8),
                     *(size_t *)((long)&local_410._M_elems[0].stream + lVar12),tmp);
      check_input(*(uchar ***)((long)local_410._M_elems + lVar12 + -8),
                  *(size_t *)((long)&local_410._M_elems[0].stream + lVar12));
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x88);
    local_468._M_elems[6] = 0;
    local_468._M_elems[7] = 0;
    local_468._M_elems[4] = 0;
    local_468._M_elems[5] = 0;
    local_468._M_elems[2] = 0;
    local_468._M_elems[3] = 0;
    local_468._M_elems[0] = 0;
    local_468._M_elems[1] = 0;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"fill_root",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", root\n",7);
    local_470.i = &__debug_indent_str_abi_cxx11_;
    std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
    local_420 = tmp;
    while ((local_468._M_elems[2] != 0 ||
           (fill<8U,_2U,_buffer_layout_bfs>::operator()(&local_471,&local_410,local_390,&local_468),
           local_468._M_elems[2] != 0))) {
      if ((local_468._M_elems[3] == 0) &&
         (fill<8U,_3U,_buffer_layout_bfs>::operator()
                    ((fill<8U,_3U,_buffer_layout_bfs> *)&local_471,&local_410,local_390,&local_468),
         local_468._M_elems[3] == 0)) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"right stream drained\n",0x15);
        if (local_468._M_elems[2] == 0) {
          __assert_fail("buffer_count[2] != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                        ,0x247,
                        "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 8U, BufferLayout = buffer_layout_bfs]"
                       );
        }
        if (local_468._M_elems[3] != 0) {
          __assert_fail("buffer_count[3] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                        ,0x248,
                        "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 8U, BufferLayout = buffer_layout_bfs]"
                       );
        }
        while (uVar4 = local_468._M_elems[2], local_468._M_elems[2] != 0) {
          memmove(tmp,local_350 + -local_468._M_elems[2],
                  (long)local_350 - (long)(local_350 + -local_468._M_elems[2]));
          local_468._M_elems[2] = 0;
          fill<8U,_2U,_buffer_layout_bfs>::operator()(&local_471,&local_410,local_390,&local_468);
          tmp = tmp + uVar4;
        }
        goto LAB_0011e94e;
      }
      lVar13 = 8 - local_468._M_elems[2];
      lVar12 = 8 - local_468._M_elems[3];
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"L:\'",3);
      puVar3 = local_390[lVar13];
      if (puVar3 == (uchar *)0x0) {
        std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
      }
      else {
        sVar8 = strlen((char *)puVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)puVar3,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\', R:\'",6);
      __s = (char *)local_350[lVar12];
      if (__s == (char *)0x0) {
        std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
      }
      else {
        sVar8 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'\n",2);
      puVar3 = local_390[lVar13];
      if (puVar3 == (uchar *)0x0) {
        __assert_fail("a != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
      }
      __s2 = (uchar *)local_350[lVar12];
      if (__s2 == (uchar *)0x0) {
        __assert_fail("b != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
      }
      iVar5 = strcmp((char *)puVar3,(char *)__s2);
      if (iVar5 < 1) {
        __s2 = puVar3;
      }
      *tmp = __s2;
      local_468._M_elems[(ulong)(0 < iVar5) + 2] = local_468._M_elems[(ulong)(0 < iVar5) + 2] - 1;
      tmp = tmp + 1;
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"left stream drained\n",0x14);
    if (local_468._M_elems[2] != 0) {
      __assert_fail("buffer_count[2] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x238,
                    "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 8U, BufferLayout = buffer_layout_bfs]"
                   );
    }
    if (local_468._M_elems[3] == 0) {
      __assert_fail("buffer_count[3] != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x239,
                    "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 8U, BufferLayout = buffer_layout_bfs]"
                   );
    }
    do {
      uVar4 = local_468._M_elems[3];
      if (local_468._M_elems[3] != 0) {
        if (local_468._M_elems[3] * 8 != 0) {
          memmove(tmp,auStack_310 + local_468._M_elems[3] * -8,local_468._M_elems[3] * 8);
        }
        local_468._M_elems[3] = 0;
        fill<8U,_3U,_buffer_layout_bfs>::operator()
                  ((fill<8U,_3U,_buffer_layout_bfs> *)&local_471,&local_410,local_390,&local_468);
        tmp = tmp + uVar4;
      }
    } while (uVar4 != 0);
LAB_0011e94e:
    anon_func::DI::~DI(&local_470);
    n0 = local_418;
    memcpy(strings,local_420,local_418 * 8);
    check_input(strings,n0);
  }
  return;
}

Assistant:

static void
funnelsort(unsigned char** strings, size_t n, unsigned char** restrict tmp)
{
	debug() << __func__ << "(), n=" << n << "\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	size_t splitter = n/K;
	std::array<Stream, K> streams;
	streams[0].stream = strings;
	streams[0].n      = splitter;
	for (unsigned i=1; i < K-1; ++i) {
		streams[i].stream = streams[i-1].stream + splitter;
		streams[i].n = splitter;
	}
	streams[K-1].stream = streams[K-2].stream + splitter;
	streams[K-1].n      = n - (K-1)*splitter;
	for (unsigned i=0; i < K; ++i) {
		funnelsort<(K>16?K/4:K/2),BufferLayout>(streams[i].stream,
		                                        streams[i].n, tmp);
		check_input(streams[i].stream, streams[i].n);
	}
	std::array<unsigned char*, buffer_total_size<K>::value> buffers;
	std::array<size_t, K> buffer_count;
	buffer_count.fill(0);
	fill_root<K,BufferLayout>(streams,tmp,buffers.data(),buffer_count);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
	check_input(strings, n);
}